

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>
          (Data *this,uint16 op,ByteCodeWriter *writer)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint byteSize;
  undefined6 in_register_00000032;
  uint16 *data;
  undefined1 local_1c;
  undefined1 local_1b;
  uint16 local_1a [3];
  byte byteop;
  byte byteop_1;
  uint16 op_local;
  
  uVar1 = this->currentOffset;
  local_1a[0] = op;
  if ((uint)CONCAT62(in_register_00000032,op) < 0x100) {
    data = (uint16 *)&local_1c;
    local_1c = (undefined1)op;
    byteSize = 1;
  }
  else {
    local_1b = 1;
    Write(this,&local_1b,1);
    data = local_1a;
    byteSize = 2;
  }
  Write(this,data,byteSize);
  if ((uint)(0xff < local_1a[0]) * 2 + 1 != this->currentOffset - uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd2e,
                                "(OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout) == (currentOffset - offset))"
                                ,
                                "OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout) == (currentOffset - offset)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Data::EncodeOpCode<SmallLayout>(
        uint16 op,
        ByteCodeWriter* writer)
    {
        DebugOnly(const uint offset = currentOffset);
        if (op <= (uint16)Js::OpCode::MaxByteSizedOpcodes)
        {
            byte byteop = (byte)op;
            Write(&byteop, sizeof(byte));
        }
        else
        {
            byte byteop = (byte)Js::OpCode::ExtendedOpcodePrefix;
            Write(&byteop, sizeof(byte));
            Write(&op, sizeof(uint16));
        }
        Assert(OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout)
               == (currentOffset - offset));
    }